

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Symbol>::copyAppend
          (QGenericArrayOps<QCss::Symbol> *this,Symbol *b,Symbol *e)

{
  Symbol *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Symbol *in_RDI;
  Symbol *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCss::Symbol>::begin((QArrayDataPointer<QCss::Symbol> *)0xa4d777);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCss::Symbol::Symbol(this_00,in_RDI);
      local_10 = local_10 + 0x28;
      (in_RDI->text).d.ptr = (char16_t *)((long)(in_RDI->text).d.ptr + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }